

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_double_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,double value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  uint64_t value_as_uint64;
  int result;
  double value_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 0x38));
  if (((((iVar1 == 0) &&
        (iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 0x30)), iVar1 == 0)) &&
       (iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 0x28)), iVar1 == 0)) &&
      ((iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 0x20)), iVar1 == 0 &&
       (iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 0x18)), iVar1 == 0)))) &&
     ((iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 0x10)), iVar1 == 0 &&
      ((iVar1 = output_byte(encoder_output,context,(uchar)((ulong)value >> 8)), iVar1 == 0 &&
       (iVar1 = output_byte(encoder_output,context,SUB81(value,0)), iVar1 == 0)))))) {
    return 0;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
              ,"encode_double_value",0xca3,1,"Failure encoding bytes for double");
  }
  return 0xca4;
}

Assistant:

static int encode_double_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, double value)
{
    int result;

    uint64_t value_as_uint64 = *((uint64_t*)(void*)&value);
    /* Codes_SRS_AMQPVALUE_01_290: [\<encoding name="ieee-754" code="0x82" category="fixed" width="8" label="IEEE 754-2008 binary64"/>] */
    if ((output_byte(encoder_output, context, (value_as_uint64 >> 56) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64 >> 48) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64 >> 40) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64 >> 32) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64 >> 24) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64 >> 16) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64 >> 8) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint64) & 0xFF) != 0))
    {
        /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
        LogError("Failure encoding bytes for double");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
        result = 0;
    }

    return result;
}